

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

void DeviceZxSpectrumNext(CDevice **dev,CDevice *parent,aint ramtop)

{
  CDevice *this;
  int local_58 [2];
  int initialPages [8];
  aint ramtop_local;
  CDevice *parent_local;
  CDevice **dev_local;
  
  if (ramtop != 0) {
    WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
  }
  if ((Options::IsI8080 & 1) != 0) {
    Error("Can\'t use ZXN device while in i8080 assembling mode",line,FATAL);
  }
  if ((Options::IsLR35902 & 1) != 0) {
    Error("Can\'t use ZXN device while in Sharp LR35902 assembling mode",line,FATAL);
  }
  this = (CDevice *)operator_new(0x2838);
  CDevice::CDevice(this,"ZXSPECTRUMNEXT",parent);
  *dev = this;
  local_58[0] = 0xe;
  local_58[1] = 0xf;
  initialPages[0] = 10;
  initialPages[1] = 0xb;
  initialPages[2] = 4;
  initialPages[3] = 5;
  initialPages[4] = 0;
  initialPages[5] = 1;
  initRegularSlotDevice(*dev,0x2000,8,0xe0,local_58);
  if (DAT_001e16a8._4_4_ == 0) {
    DAT_001e16a8._4_4_ = 1;
    Z80::InitNextExtensions();
  }
  return;
}

Assistant:

static void DeviceZxSpectrumNext(CDevice **dev, CDevice *parent, aint ramtop) {
	if (ramtop) WarningById(W_NO_RAMTOP);
	if (Options::IsI8080) Error("Can't use ZXN device while in i8080 assembling mode", line, FATAL);
	if (Options::IsLR35902) Error("Can't use ZXN device while in Sharp LR35902 assembling mode", line, FATAL);
	*dev = new CDevice("ZXSPECTRUMNEXT", parent);
	const int initialPages[] = {14, 15, 10, 11, 4, 5, 0, 1};	// basically same as ZX128, but 8k
	initRegularSlotDevice(*dev, 0x2000, 8, 224, initialPages);
	// auto-enable ZX Next instruction extensions
	if (0 == Options::syx.IsNextEnabled) {
		Options::syx.IsNextEnabled = 1;
		Z80::InitNextExtensions();		// add the special opcodes here (they were not added)
				// this is a bit late, but it should work as well as `--zxnext` option I believe
	}
}